

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SMDLoader.cpp
# Opt level: O3

void __thiscall
Assimp::SMDImporter::ParseSkeletonSection(SMDImporter *this,char *szCurrent,char **szCurrentOut)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  SMDImporter *this_00;
  int iVar5;
  int iTime;
  byte *local_48;
  int local_3c;
  char **local_38;
  
  local_3c = 0;
  iVar5 = 0;
  local_38 = szCurrentOut;
  do {
    this->iLineNumber = this->iLineNumber + 1;
    while (((ulong)(byte)*szCurrent < 0x21 &&
           ((0x100002600U >> ((ulong)(byte)*szCurrent & 0x3f) & 1) != 0))) {
      szCurrent = (char *)((byte *)szCurrent + 1);
    }
    local_48 = (byte *)szCurrent;
    if (*szCurrent == 0) goto LAB_0060d80b;
    iVar4 = (byte)*szCurrent - 0x65;
    if ((iVar4 == 0) && (iVar4 = ((byte *)szCurrent)[1] - 0x6e, iVar4 == 0)) {
      iVar4 = 100 - (uint)((byte *)szCurrent)[2];
    }
    else {
      iVar4 = -iVar4;
    }
    if (iVar4 == 0) {
      bVar2 = ((byte *)szCurrent)[3];
      if (((ulong)bVar2 < 0x21) && ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) != 0)) {
        local_48 = (byte *)szCurrent + (4 - (ulong)(bVar2 == 0));
LAB_0060d80b:
        *local_38 = (char *)local_48;
        return;
      }
    }
    this_00 = (SMDImporter *)0x6d8b98;
    iVar4 = strncmp("time",szCurrent,4);
    if (iVar4 == 0) {
      bVar2 = ((byte *)szCurrent)[4];
      if ((0x20 < (ulong)bVar2) || ((0x100003601U >> ((ulong)bVar2 & 0x3f) & 1) == 0))
      goto LAB_0060d768;
      local_48 = (byte *)szCurrent + (5 - (ulong)(bVar2 == 0));
      bVar3 = ParseSignedInt(this_00,(char *)local_48,(char **)&local_48,&local_3c);
      if (!bVar3) goto LAB_0060d80b;
      iVar5 = this->iSmallestFrame;
      if (local_3c < this->iSmallestFrame) {
        iVar5 = local_3c;
      }
      this->iSmallestFrame = iVar5;
      szCurrent = (char *)local_48;
      while( true ) {
        bVar2 = *szCurrent;
        if ((bVar2 < 0xe) && ((0x2401U >> (bVar2 & 0x1f) & 1) != 0)) break;
        szCurrent = (char *)((byte *)szCurrent + 1);
      }
      while ((bVar2 == 0xd || (bVar2 == 10))) {
        pbVar1 = (byte *)szCurrent + 1;
        szCurrent = (char *)((byte *)szCurrent + 1);
        bVar2 = *pbVar1;
      }
      this->iLineNumber = this->iLineNumber + 1;
      iVar5 = local_3c;
    }
    else {
LAB_0060d768:
      ParseSkeletonElement(this,szCurrent,(char **)&local_48,iVar5);
      szCurrent = (char *)local_48;
    }
  } while( true );
}

Assistant:

void SMDImporter::ParseSkeletonSection(const char* szCurrent, const char** szCurrentOut) {
    int iTime = 0;
    for ( ;; ) {
        if (!SkipSpacesAndLineEnd(szCurrent,&szCurrent)) {
            break;
        }

        // "end\n" - Ends the skeleton section
        if (TokenMatch(szCurrent,"end",3)) {
            break;
        } else if (TokenMatch(szCurrent,"time",4)) {
        // "time <n>\n" - Specifies the current animation frame
            if(!ParseSignedInt(szCurrent,&szCurrent,iTime)) {
                break;
            }

            iSmallestFrame = std::min(iSmallestFrame,iTime);
            SkipLine(szCurrent,&szCurrent);
        } else {
            ParseSkeletonElement(szCurrent,&szCurrent,iTime);
        }
    }
    *szCurrentOut = szCurrent;
}